

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O0

string * tao::pegtl::internal::demangle<queryparse::close_curly>(void)

{
  string *in_RDI;
  char *in_stack_00000048;
  
  std::type_info::name((type_info *)&queryparse::close_curly::typeinfo);
  demangle_abi_cxx11_(in_stack_00000048);
  return in_RDI;
}

Assistant:

std::string demangle()
         {
            return demangle( typeid( T ).name() );
         }